

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
Chainstate::ActivateBestChainStep
          (Chainstate *this,BlockValidationState *state,CBlockIndex *pindexMostWork,
          shared_ptr<const_CBlock> *pblock,bool *fInvalidFound,ConnectTrace *connectTrace)

{
  int iVar1;
  pointer ppCVar2;
  CBlockIndex *pCVar3;
  Notifications *notifications;
  CTxMemPool *this_00;
  int height;
  bool bVar4;
  bool bVar5;
  CBlockIndex *pCVar6;
  CCoinsViewCache *active_coins_tip;
  bool bVar7;
  int iVar8;
  pointer ppCVar9;
  long in_FS_OFFSET;
  CBlockIndex *local_158;
  CBlockIndex *local_120;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> vpindexToConnect;
  DisconnectedBlockTransactions disconnectpool;
  undefined1 local_88 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_70;
  _Alloc_hider _Stack_60;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppCVar2 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_158 = (CBlockIndex *)0x0;
  }
  else {
    local_158 = ppCVar2[-1];
  }
  pCVar6 = CChain::FindFork(&this->m_chain,pindexMostWork);
  DisconnectedBlockTransactions::DisconnectedBlockTransactions(&disconnectpool,20000000);
  bVar7 = false;
  do {
    ppCVar2 = (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (((ppCVar2 ==
          (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start) ||
        (pCVar3 = ppCVar2[-1], pCVar3 == (CBlockIndex *)0x0)) || (pCVar3 == pCVar6)) {
      vpindexToConnect.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vpindexToConnect.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vpindexToConnect.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pCVar6 == (CBlockIndex *)0x0) {
        iVar8 = -1;
      }
      else {
        iVar8 = pCVar6->nHeight;
      }
      bVar4 = true;
      goto LAB_008b3f5f;
    }
    bVar4 = DisconnectTip(this,state,&disconnectpool);
    bVar7 = true;
  } while (bVar4);
  MaybeUpdateMempoolForReorg(this,&disconnectpool,false);
  notifications = (this->m_chainman->m_options).notifications;
  _((bilingual_str *)local_88,(ConstevalStringLiteral)0xcd1f04);
  FatalError(notifications,state,(bilingual_str *)local_88);
  bilingual_str::~bilingual_str((bilingual_str *)local_88);
  bVar7 = false;
LAB_008b41a4:
  DisconnectedBlockTransactions::~DisconnectedBlockTransactions(&disconnectpool);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar7;
LAB_008b3f5f:
  if ((!bVar4) || (iVar1 = pindexMostWork->nHeight, iVar8 == iVar1)) goto LAB_008b414d;
  height = iVar8 + 0x20;
  if (iVar1 < iVar8 + 0x20) {
    height = iVar1;
  }
  if (vpindexToConnect.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      vpindexToConnect.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    vpindexToConnect.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         vpindexToConnect.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::reserve
            (&vpindexToConnect,(long)(height - iVar8));
  for (local_120 = CBlockIndex::GetAncestor(pindexMostWork,height);
      (ppCVar2 = vpindexToConnect.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
      ppCVar9 = vpindexToConnect.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                _M_impl.super__Vector_impl_data._M_finish, local_120 != (CBlockIndex *)0x0 &&
      (local_120->nHeight != iVar8)); local_120 = local_120->pprev) {
    std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::push_back
              (&vpindexToConnect,&local_120);
  }
  do {
    bVar4 = ppCVar9 == ppCVar2;
    iVar8 = height;
    if (bVar4) break;
    pCVar6 = ppCVar9[-1];
    if (pCVar6 == pindexMostWork) {
      std::__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2> *)local_88,
                 &pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>);
    }
    else {
      local_88._0_8_ = (pointer)0x0;
      local_88._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
    }
    bVar5 = ConnectTip(this,state,pCVar6,(shared_ptr<const_CBlock> *)local_88,connectTrace,
                       &disconnectpool);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    if (!bVar5) {
      if ((state->super_ValidationState<BlockValidationResult>).m_mode != M_INVALID) {
        MaybeUpdateMempoolForReorg(this,&disconnectpool,false);
        bVar7 = false;
        goto LAB_008b419a;
      }
      if ((state->super_ValidationState<BlockValidationResult>).m_result != BLOCK_MUTATED) {
        InvalidChainFound(this,*vpindexToConnect.
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
      }
      local_88._0_8_ = (pointer)0x0;
      local_88._16_8_ = 0;
      aStack_70._8_8_ = (pointer)0x0;
      local_58._0_8_ = 0;
      local_58._16_8_ = 0;
      local_88._8_8_ = &aStack_70;
      aStack_70._0_8_ = 0;
      _Stack_60._M_p = local_58 + 8;
      local_58._8_8_ = 0;
      ValidationState<BlockValidationResult>::operator=
                (&state->super_ValidationState<BlockValidationResult>,
                 (ValidationState<BlockValidationResult> *)local_88);
      ValidationState<BlockValidationResult>::~ValidationState
                ((ValidationState<BlockValidationResult> *)local_88);
      *fInvalidFound = true;
      break;
    }
    PruneBlockIndexCandidates(this);
    if (local_158 == (CBlockIndex *)0x0) break;
    bVar5 = operator>(&((this->m_chain).vChain.
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_finish[-1]->nChainWork).super_base_uint<256U>,
                      &(local_158->nChainWork).super_base_uint<256U>);
    ppCVar9 = ppCVar9 + -1;
  } while (!bVar5);
  goto LAB_008b3f5f;
LAB_008b414d:
  if (bVar7) {
    MaybeUpdateMempoolForReorg(this,&disconnectpool,true);
  }
  this_00 = this->m_mempool;
  if (this_00 != (CTxMemPool *)0x0) {
    active_coins_tip = CoinsTip(this);
    CTxMemPool::check(this_00,active_coins_tip,
                      (long)(int)((ulong)((long)(this->m_chain).vChain.
                                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->m_chain).vChain.
                                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  bVar7 = true;
  CheckForkWarningConditions(this);
LAB_008b419a:
  std::_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::~_Vector_base
            (&vpindexToConnect.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>);
  goto LAB_008b41a4;
}

Assistant:

bool Chainstate::ActivateBestChainStep(BlockValidationState& state, CBlockIndex* pindexMostWork, const std::shared_ptr<const CBlock>& pblock, bool& fInvalidFound, ConnectTrace& connectTrace)
{
    AssertLockHeld(cs_main);
    if (m_mempool) AssertLockHeld(m_mempool->cs);

    const CBlockIndex* pindexOldTip = m_chain.Tip();
    const CBlockIndex* pindexFork = m_chain.FindFork(pindexMostWork);

    // Disconnect active blocks which are no longer in the best chain.
    bool fBlocksDisconnected = false;
    DisconnectedBlockTransactions disconnectpool{MAX_DISCONNECTED_TX_POOL_BYTES};
    while (m_chain.Tip() && m_chain.Tip() != pindexFork) {
        if (!DisconnectTip(state, &disconnectpool)) {
            // This is likely a fatal error, but keep the mempool consistent,
            // just in case. Only remove from the mempool in this case.
            MaybeUpdateMempoolForReorg(disconnectpool, false);

            // If we're unable to disconnect a block during normal operation,
            // then that is a failure of our local system -- we should abort
            // rather than stay on a less work chain.
            FatalError(m_chainman.GetNotifications(), state, _("Failed to disconnect block."));
            return false;
        }
        fBlocksDisconnected = true;
    }

    // Build list of new blocks to connect (in descending height order).
    std::vector<CBlockIndex*> vpindexToConnect;
    bool fContinue = true;
    int nHeight = pindexFork ? pindexFork->nHeight : -1;
    while (fContinue && nHeight != pindexMostWork->nHeight) {
        // Don't iterate the entire list of potential improvements toward the best tip, as we likely only need
        // a few blocks along the way.
        int nTargetHeight = std::min(nHeight + 32, pindexMostWork->nHeight);
        vpindexToConnect.clear();
        vpindexToConnect.reserve(nTargetHeight - nHeight);
        CBlockIndex* pindexIter = pindexMostWork->GetAncestor(nTargetHeight);
        while (pindexIter && pindexIter->nHeight != nHeight) {
            vpindexToConnect.push_back(pindexIter);
            pindexIter = pindexIter->pprev;
        }
        nHeight = nTargetHeight;

        // Connect new blocks.
        for (CBlockIndex* pindexConnect : vpindexToConnect | std::views::reverse) {
            if (!ConnectTip(state, pindexConnect, pindexConnect == pindexMostWork ? pblock : std::shared_ptr<const CBlock>(), connectTrace, disconnectpool)) {
                if (state.IsInvalid()) {
                    // The block violates a consensus rule.
                    if (state.GetResult() != BlockValidationResult::BLOCK_MUTATED) {
                        InvalidChainFound(vpindexToConnect.front());
                    }
                    state = BlockValidationState();
                    fInvalidFound = true;
                    fContinue = false;
                    break;
                } else {
                    // A system error occurred (disk space, database error, ...).
                    // Make the mempool consistent with the current tip, just in case
                    // any observers try to use it before shutdown.
                    MaybeUpdateMempoolForReorg(disconnectpool, false);
                    return false;
                }
            } else {
                PruneBlockIndexCandidates();
                if (!pindexOldTip || m_chain.Tip()->nChainWork > pindexOldTip->nChainWork) {
                    // We're in a better position than we were. Return temporarily to release the lock.
                    fContinue = false;
                    break;
                }
            }
        }
    }

    if (fBlocksDisconnected) {
        // If any blocks were disconnected, disconnectpool may be non empty.  Add
        // any disconnected transactions back to the mempool.
        MaybeUpdateMempoolForReorg(disconnectpool, true);
    }
    if (m_mempool) m_mempool->check(this->CoinsTip(), this->m_chain.Height() + 1);

    CheckForkWarningConditions();

    return true;
}